

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask6_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  long unaff_RBX;
  long unaff_RBP;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  vpmovsxbd_avx(ZEXT416(0x543c2814));
  vpmovsxbd_avx(ZEXT416(0x442c1804));
  uVar1 = in[0x1a];
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar8._8_8_ = 0x400000002;
  auVar8._0_8_ = 0x400000002;
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar6 = vpsllvd_avx2(auVar4,_DAT_0019ba00);
  auVar4 = vpshufd_avx(auVar3,0x50);
  auVar5 = vpshufd_avx(auVar8,0x50);
  auVar4 = vpsrlvd_avx2(auVar4,auVar5);
  auVar4 = vpblendd_avx2(auVar4,ZEXT416(*in),1);
  auVar4 = vpinsrd_avx(auVar4,in[0x10],3);
  auVar4 = vpor_avx(auVar6,auVar4);
  vpmovsxbd_avx(ZEXT416(0x48301c08));
  auVar5 = vpgatherdd_avx512vl(*in);
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001990f0);
  vpmovsxbd_avx(ZEXT416(0x4c34200c));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar6 = vpsllvd_avx2(auVar6,_DAT_00199110);
  vpmovsxbd_avx(ZEXT416(0x50382410));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)out));
  auVar6 = vpternlogd_avx512vl(auVar6,auVar5,auVar4,0xfe);
  auVar4 = vpsllvd_avx2(auVar7,_DAT_00199130);
  auVar5 = vpsllvd_avx2(auVar3,_DAT_00199140);
  auVar5 = vpternlogd_avx512vl(auVar5,auVar4,auVar6,0xfe);
  auVar4 = vpshufd_avx(auVar3,0xff);
  uVar2 = in[0x18];
  auVar4 = vpinsrd_avx(auVar4,uVar1,1);
  *(undefined1 (*) [16])out = auVar5;
  auVar5 = vpsrlvd_avx2(auVar4,auVar8);
  auVar4 = vpinsrd_avx(ZEXT416(uVar2),in[0x1d],1);
  auVar6 = vpsllvd_avx2(auVar4,_DAT_001991b0);
  auVar4 = vpinsrd_avx(ZEXT416(in[0x16]),in[0x1b],1);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_0018b930);
  auVar5 = vpor_avx(auVar4,auVar5);
  auVar4 = vpinsrd_avx(ZEXT416(in[0x17]),in[0x1c],1);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_001991a0);
  auVar6 = vpternlogd_avx512vl(auVar6,auVar4,auVar5,0xfe);
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),in[0x1f],1);
  auVar5 = vpsllvd_avx2(auVar4,_DAT_001991d0);
  auVar4 = vpinsrd_avx(ZEXT416(in[0x19]),in[0x1e],1);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_001991c0);
  auVar4 = vpternlogd_avx512vl(auVar5,auVar4,auVar6,0xfe);
  *(long *)(out + 4) = auVar4._0_8_;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask6_32(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (6 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (6 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  ++in;

  return out;
}